

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbPush.c
# Opt level: O0

int Acb_ObjSuppMin_int(Acb_Ntk_t *p,int iObj)

{
  int i;
  int iVar1;
  word wVar2;
  int *piVar3;
  Vec_Int_t *p_00;
  word uTruth;
  int *pFanins;
  int local_20;
  int iFanin;
  int k;
  int iObj_local;
  Acb_Ntk_t *p_local;
  
  wVar2 = Acb_ObjTruth(p,iObj);
  local_20 = 0;
  piVar3 = Acb_ObjFanins(p,iObj);
  while( true ) {
    if (*piVar3 <= local_20) {
      return 0;
    }
    i = piVar3[local_20 + 1];
    iVar1 = Abc_Tt6HasVar(wVar2,local_20);
    if (iVar1 == 0) break;
    local_20 = local_20 + 1;
  }
  Acb_ObjDeleteFaninIndex(p,iObj,local_20);
  p_00 = Vec_WecEntry(&p->vFanouts,i);
  Vec_IntRemove(p_00,iObj);
  wVar2 = Abc_Tt6RemoveVar(wVar2,local_20);
  Vec_WrdWriteEntry(&p->vObjTruth,iObj,wVar2);
  return 1;
}

Assistant:

int Acb_ObjSuppMin_int( Acb_Ntk_t * p, int iObj )
{
    int k, iFanin, * pFanins;
    word uTruth = Acb_ObjTruth( p, iObj );
    Acb_ObjForEachFaninFast( p, iObj, pFanins, iFanin, k )
    {
        if ( Abc_Tt6HasVar(uTruth, k) )
            continue;
        Acb_ObjDeleteFaninIndex( p, iObj, k );
        Vec_IntRemove( Vec_WecEntry(&p->vFanouts, iFanin), iObj );
        Vec_WrdWriteEntry( &p->vObjTruth, iObj, Abc_Tt6RemoveVar(uTruth, k) );
        return 1;
    }
    return 0;
}